

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

void __thiscall
gl4cts::FunctionObject::unary<tcu::Vector<double,_4>,_tcu::Vector<double,_4>_>::call
          (unary<tcu::Vector<double,_4>,_tcu::Vector<double,_4>_> *this,GLvoid *result_dst,
          GLvoid *argument_src)

{
  double local_88 [4];
  code *local_68;
  functionPointer p_function;
  Vector<double,_4> arg;
  Vector<double,_4> result;
  GLvoid *argument_src_local;
  GLvoid *result_dst_local;
  unary<tcu::Vector<double,_4>,_tcu::Vector<double,_4>_> *this_local;
  
  tcu::Vector<double,_4>::Vector((Vector<double,_4> *)(arg.m_data + 3));
  tcu::Vector<double,_4>::Vector((Vector<double,_4> *)&p_function);
  unpack<tcu::Vector<double,_4>_>::get(argument_src,(Vector<double,_4> *)&p_function);
  local_68 = (code *)(this->super_unaryBase).super_functionObject.m_p_function;
  (*local_68)(local_88,&p_function);
  arg.m_data[3] = local_88[0];
  pack<tcu::Vector<double,_4>_>::set(result_dst,(Vector<double,_4> *)(arg.m_data + 3));
  return;
}

Assistant:

virtual void call(glw::GLvoid* result_dst, const glw::GLvoid* argument_src) const
	{
		ResT result;
		ArgT arg;

		unpack<ArgT>::get(argument_src, arg);

		functionPointer p_function = (functionPointer)m_p_function;

		result = p_function(arg);

		pack<ResT>::set(result_dst, result);
	}